

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TetrahedralityHBMatrix.cpp
# Opt level: O2

void __thiscall
OpenMD::TetrahedralityHBMatrix::TetrahedralityHBMatrix
          (TetrahedralityHBMatrix *this,SimInfo *info,string *filename,string *sele,double rCut,
          double OOcut,double thetaCut,double OHcut,int nbins)

{
  SelectionEvaluator *this_00;
  ostream *poVar1;
  uint i;
  ulong uVar2;
  ulong __new_size;
  long lVar3;
  string paramString;
  stringstream params;
  string local_200;
  string *local_1e0;
  RealType local_1d8;
  RealType local_1d0;
  RealType local_1c8;
  RealType local_1c0;
  undefined1 local_1b8 [392];
  
  local_1d8 = rCut;
  local_1d0 = OOcut;
  local_1c8 = thetaCut;
  local_1c0 = OHcut;
  StaticAnalyser::StaticAnalyser(&this->super_StaticAnalyser,info,filename,nbins);
  (this->super_StaticAnalyser)._vptr_StaticAnalyser =
       (_func_int **)&PTR__TetrahedralityHBMatrix_002ee8d0;
  std::__cxx11::string::string((string *)&this->selectionScript_,(string *)sele);
  local_1e0 = &this->selectionScript_;
  SelectionManager::SelectionManager(&this->seleMan_,info);
  this_00 = &this->evaluator_;
  SelectionEvaluator::SelectionEvaluator(this_00,info);
  this->rCut_ = local_1d8;
  this->OOCut_ = local_1d0;
  this->thetaCut_ = local_1c8;
  this->OHCut_ = local_1c0;
  (this->Q_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->Q_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->Q_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->Q_histogram_).
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Q_histogram_).
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Q_histogram_).
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b8,"Tetrahedrality HBond Matrix",(allocator<char> *)&local_200);
  std::__cxx11::string::_M_assign((string *)&(this->super_StaticAnalyser).analysisType_);
  std::__cxx11::string::~string((string *)local_1b8);
  getPrefix(&local_200,filename);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
                 &local_200,".hbq");
  std::__cxx11::string::_M_assign((string *)&(this->super_StaticAnalyser).outputFilename_);
  std::__cxx11::string::~string((string *)local_1b8);
  std::__cxx11::string::~string((string *)&local_200);
  SelectionEvaluator::loadScriptString(this_00,sele);
  if ((this->evaluator_).isDynamic_ == false) {
    SelectionEvaluator::evaluate((SelectionSet *)local_1b8,this_00);
    SelectionManager::setSelectionSet(&this->seleMan_,(SelectionSet *)local_1b8);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)local_1b8);
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::resize(&this->Q_histogram_,(ulong)(this->super_StaticAnalyser).nBins_);
  lVar3 = 0;
  for (uVar2 = 0; __new_size = (ulong)(this->super_StaticAnalyser).nBins_, uVar2 < __new_size;
      uVar2 = uVar2 + 1) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               ((long)&(((this->Q_histogram_).
                         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                       super__Vector_impl_data + lVar3),__new_size);
    lVar3 = lVar3 + 0x18;
  }
  this->MinQ_ = 0.0;
  this->MaxQ_ = 1.1;
  this->deltaQ_ = 1.1 / (double)__new_size;
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  std::operator<<((ostream *)(local_1b8 + 0x10)," rCut = ");
  poVar1 = std::ostream::_M_insert<double>(this->rCut_);
  std::operator<<(poVar1,", OOcut = ");
  poVar1 = std::ostream::_M_insert<double>(this->OOCut_);
  std::operator<<(poVar1,", thetacut = ");
  poVar1 = std::ostream::_M_insert<double>(this->thetaCut_);
  std::operator<<(poVar1,", OHcut = ");
  poVar1 = std::ostream::_M_insert<double>(this->OHCut_);
  poVar1 = std::operator<<(poVar1,", nbins = ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,", deltaQ = ");
  std::ostream::_M_insert<double>(this->deltaQ_);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::_M_assign((string *)&(this->super_StaticAnalyser).paramString_);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  return;
}

Assistant:

TetrahedralityHBMatrix::TetrahedralityHBMatrix(
      SimInfo* info, const std::string& filename, const std::string& sele,
      double rCut, double OOcut, double thetaCut, double OHcut, int nbins) :
      StaticAnalyser(info, filename, nbins),
      selectionScript_(sele), seleMan_(info), evaluator_(info), rCut_(rCut),
      OOCut_(OOcut), thetaCut_(thetaCut), OHCut_(OHcut) {
    setAnalysisType("Tetrahedrality HBond Matrix");
    setOutputName(getPrefix(filename) + ".hbq");

    evaluator_.loadScriptString(sele);
    if (!evaluator_.isDynamic()) {
      seleMan_.setSelectionSet(evaluator_.evaluate());
    }

    Q_histogram_.resize(nBins_);

    for (unsigned int i = 0; i < nBins_; i++) {
      Q_histogram_[i].resize(nBins_);
    }

    // Q can take values from 0 to 1

    MinQ_   = 0.0;
    MaxQ_   = 1.1;
    deltaQ_ = (MaxQ_ - MinQ_) / nBins_;

    std::stringstream params;
    params << " rCut = " << rCut_ << ", OOcut = " << OOCut_
           << ", thetacut = " << thetaCut_ << ", OHcut = " << OHCut_
           << ", nbins = " << nBins_ << ", deltaQ = " << deltaQ_;
    const std::string paramString = params.str();
    setParameterString(paramString);
  }